

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O0

HighsInt Highs_readModel(void *highs,char *filename)

{
  HighsStatus HVar1;
  char *in_RSI;
  string *in_stack_000009f0;
  Highs *in_stack_000009f8;
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,in_RSI,&local_31);
  HVar1 = Highs::readModel(in_stack_000009f8,in_stack_000009f0);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return HVar1;
}

Assistant:

HighsInt Highs_readModel(void* highs, const char* filename) {
  return (HighsInt)((Highs*)highs)->readModel(std::string(filename));
}